

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000b55a40 = 0x2d2d2d2d2d2d2d;
    uRam0000000000b55a47._0_1_ = '-';
    uRam0000000000b55a47._1_1_ = '-';
    uRam0000000000b55a47._2_1_ = '-';
    uRam0000000000b55a47._3_1_ = '-';
    uRam0000000000b55a47._4_1_ = '-';
    uRam0000000000b55a47._5_1_ = '-';
    uRam0000000000b55a47._6_1_ = '-';
    uRam0000000000b55a47._7_1_ = '-';
    DAT_00b55a30 = '-';
    DAT_00b55a30_1._0_1_ = '-';
    DAT_00b55a30_1._1_1_ = '-';
    DAT_00b55a30_1._2_1_ = '-';
    DAT_00b55a30_1._3_1_ = '-';
    DAT_00b55a30_1._4_1_ = '-';
    DAT_00b55a30_1._5_1_ = '-';
    DAT_00b55a30_1._6_1_ = '-';
    uRam0000000000b55a38 = 0x2d2d2d2d2d2d2d;
    DAT_00b55a3f = 0x2d;
    DAT_00b55a20 = '-';
    DAT_00b55a20_1._0_1_ = '-';
    DAT_00b55a20_1._1_1_ = '-';
    DAT_00b55a20_1._2_1_ = '-';
    DAT_00b55a20_1._3_1_ = '-';
    DAT_00b55a20_1._4_1_ = '-';
    DAT_00b55a20_1._5_1_ = '-';
    DAT_00b55a20_1._6_1_ = '-';
    uRam0000000000b55a28._0_1_ = '-';
    uRam0000000000b55a28._1_1_ = '-';
    uRam0000000000b55a28._2_1_ = '-';
    uRam0000000000b55a28._3_1_ = '-';
    uRam0000000000b55a28._4_1_ = '-';
    uRam0000000000b55a28._5_1_ = '-';
    uRam0000000000b55a28._6_1_ = '-';
    uRam0000000000b55a28._7_1_ = '-';
    DAT_00b55a10 = '-';
    DAT_00b55a10_1._0_1_ = '-';
    DAT_00b55a10_1._1_1_ = '-';
    DAT_00b55a10_1._2_1_ = '-';
    DAT_00b55a10_1._3_1_ = '-';
    DAT_00b55a10_1._4_1_ = '-';
    DAT_00b55a10_1._5_1_ = '-';
    DAT_00b55a10_1._6_1_ = '-';
    uRam0000000000b55a18._0_1_ = '-';
    uRam0000000000b55a18._1_1_ = '-';
    uRam0000000000b55a18._2_1_ = '-';
    uRam0000000000b55a18._3_1_ = '-';
    uRam0000000000b55a18._4_1_ = '-';
    uRam0000000000b55a18._5_1_ = '-';
    uRam0000000000b55a18._6_1_ = '-';
    uRam0000000000b55a18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000b55a08._0_1_ = '-';
    uRam0000000000b55a08._1_1_ = '-';
    uRam0000000000b55a08._2_1_ = '-';
    uRam0000000000b55a08._3_1_ = '-';
    uRam0000000000b55a08._4_1_ = '-';
    uRam0000000000b55a08._5_1_ = '-';
    uRam0000000000b55a08._6_1_ = '-';
    uRam0000000000b55a08._7_1_ = '-';
    DAT_00b55a4f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}